

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::AddAllocatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,Message *new_entry)

{
  byte bVar1;
  Descriptor *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  char *description;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection != this) {
LAB_001f5179:
    pDVar2 = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar5.descriptor,field,"AddAllocatedMessage");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_001f51b8:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"AddAllocatedMessage",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    AddAllocatedMessage();
    goto LAB_001f5179;
  }
  if ((bVar1 & 0x20) == 0) {
    description = "Field is singular; the method requires a repeated field.";
    goto LAB_001f51b8;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (pDVar2,field,"AddAllocatedMessage",CPPTYPE_MESSAGE);
  }
  if ((bVar1 & 8) != 0) {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    internal::ExtensionSet::AddAllocatedMessage
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),field,
               &new_entry->super_MessageLite);
    return;
  }
  if (field->type_ == 0xb) {
    bVar3 = FieldDescriptor::is_map_message_type(field);
    if (bVar3) {
      VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
      this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
      this_01 = internal::MapFieldBase::MutableRepeatedField(this_00);
      goto LAB_001f514e;
    }
  }
  VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
  this_01 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
LAB_001f514e:
  internal::RepeatedPtrFieldBase::
  AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (this_01,new_entry);
  return;
}

Assistant:

void Reflection::AddAllocatedMessage(Message* message,
                                     const FieldDescriptor* field,
                                     Message* new_entry) const {
  USAGE_MUTABLE_CHECK_ALL(AddAllocatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->AddAllocatedMessage(field, new_entry);
  } else {
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    repeated->AddAllocated<GenericTypeHandler<Message> >(new_entry);
  }
}